

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.h
# Opt level: O1

void __thiscall
jrtplib::RTPUDPv6TransmissionInfo::~RTPUDPv6TransmissionInfo(RTPUDPv6TransmissionInfo *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPUDPv6TransmissionInfo_001445a8;
  p_Var2 = (this->localIPlist).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->localIPlist) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

~RTPUDPv6TransmissionInfo()								{ }